

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

void google::protobuf::compiler::java::PrintGeneratedAnnotation
               (Printer *printer,char delimiter,string *annotation_file)

{
  ulong uVar1;
  char *text;
  allocator<char> local_41;
  string local_40 [8];
  string ptemplate;
  string *annotation_file_local;
  char delimiter_local;
  Printer *printer_local;
  
  ptemplate.field_2._8_8_ = annotation_file;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"@javax.annotation.Generated(value=\"protoc\", comments=\"annotations:",
               &local_41);
    std::allocator<char>::~allocator(&local_41);
    std::__cxx11::string::push_back((char)local_40);
    std::__cxx11::string::append((char *)local_40);
    std::__cxx11::string::push_back((char)local_40);
    std::__cxx11::string::append((char *)local_40);
    text = (char *)std::__cxx11::string::c_str();
    io::Printer::Print(printer,text,"annotation_file",(string *)ptemplate.field_2._8_8_);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

void PrintGeneratedAnnotation(io::Printer* printer, char delimiter,
                              const string& annotation_file) {
  if (annotation_file.empty()) {
    return;
  }
  string ptemplate =
      "@javax.annotation.Generated(value=\"protoc\", comments=\"annotations:";
  ptemplate.push_back(delimiter);
  ptemplate.append("annotation_file");
  ptemplate.push_back(delimiter);
  ptemplate.append("\")\n");
  printer->Print(ptemplate.c_str(), "annotation_file", annotation_file);
}